

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_HexEncoding.h
# Opt level: O0

void axl::enc::impl::hexEncode<char,axl::enc::GetHexChar_u,axl::enc::impl::InsertSpace<char>>
               (char *dst,uchar_t *src,size_t size)

{
  char cVar1;
  size_t sVar2;
  ulong in_RDX;
  byte *in_RSI;
  char *in_RDI;
  uchar_t x_1;
  size_t i;
  uchar_t x;
  GetHexChar_u local_2c;
  GetHexChar_u local_2b;
  InsertSpace<char> local_2a;
  byte local_29;
  ulong local_28;
  GetHexChar_u local_1b;
  GetHexChar_u local_1a;
  byte local_19;
  ulong local_18;
  byte *local_10;
  char *local_8;
  
  local_19 = *in_RSI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  cVar1 = GetHexChar_u::operator()(&local_1a,(uchar_t)((int)(uint)local_19 >> 4));
  *local_8 = cVar1;
  local_8 = local_8 + 1;
  cVar1 = GetHexChar_u::operator()(&local_1b,local_19);
  *local_8 = cVar1;
  for (local_28 = 1; local_8 = local_8 + 1, local_28 < local_18; local_28 = local_28 + 1) {
    local_29 = local_10[local_28];
    sVar2 = InsertSpace<char>::operator()(&local_2a,local_8,local_28);
    local_8 = local_8 + sVar2;
    cVar1 = GetHexChar_u::operator()(&local_2b,(uchar_t)((int)(uint)local_29 >> 4));
    *local_8 = cVar1;
    local_8 = local_8 + 1;
    cVar1 = GetHexChar_u::operator()(&local_2c,local_29);
    *local_8 = cVar1;
  }
  return;
}

Assistant:

void
hexEncode(
	T* dst,
	const uchar_t* src,
	size_t size
) {
	uchar_t x = src[0];
	*dst++ = GetHexChar()(x >> 4);
	*dst++ = GetHexChar()(x);

	for (size_t i = 1; i < size; i++) {
		uchar_t x = src[i];
		dst += InsertSpace()(dst, i);
		*dst++ = GetHexChar()(x >> 4);
		*dst++ = GetHexChar()(x);
	}
}